

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int __thiscall fmt::v5::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  string_view message;
  int extraout_EAX;
  int iVar1;
  size_t in_R8;
  runtime_error *base;
  memory_buffer buffer;
  allocator<char> *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this_00;
  string local_2e0 [24];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [2];
  allocator<char> local_249 [533];
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  system_error *psVar2;
  
  iVar1 = (int)ctx;
  this->error_code_ = iVar1;
  psVar2 = this;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  std::allocator<char>::~allocator(local_249);
  vformat<fmt::v5::basic_string_view<char>,char>
            ((basic_string_view<char> *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd40);
  s = local_290;
  basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)in_stack_fffffffffffffd00,s);
  this_00 = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)(local_249 + 1);
  message.size_ = in_R8;
  message.data_ = (char *)psVar2;
  format_system_error((buffer *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
                      message);
  std::__cxx11::string::~string((string *)s);
  to_string<char,500ul>(in_stack_fffffffffffffd38);
  std::runtime_error::runtime_error((runtime_error *)&stack0xfffffffffffffd40,local_2e0);
  std::runtime_error::operator=
            (&this->super_runtime_error,(runtime_error *)&stack0xfffffffffffffd40);
  std::runtime_error::~runtime_error((runtime_error *)&stack0xfffffffffffffd40);
  std::__cxx11::string::~string(local_2e0);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this_00);
  return extraout_EAX;
}

Assistant:

FMT_FUNC void system_error::init(
    int err_code, string_view format_str, format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error &base = *this;
  base = std::runtime_error(to_string(buffer));
}